

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     BinaryScatterLoop<duckdb::ArgMinMaxState<duckdb::hugeint_t,int>,duckdb::hugeint_t,int,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (hugeint_t *adata,AggregateInputData *aggr_input_data,int *bdata,
               ArgMinMaxState<duckdb::hugeint_t,_int> **states,idx_t count,SelectionVector *asel,
               SelectionVector *bsel,SelectionVector *ssel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  bool bVar1;
  ulong uVar2;
  idx_t i;
  ulong uVar3;
  AggregateBinaryInput local_58;
  
  local_58.left_mask = avalidity;
  local_58.right_mask = bvalidity;
  local_58.input = aggr_input_data;
  if ((bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
      && (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask ==
         (unsigned_long *)0x0) {
    for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
      local_58.lidx = uVar3;
      if (asel->sel_vector != (sel_t *)0x0) {
        local_58.lidx = (idx_t)asel->sel_vector[uVar3];
      }
      local_58.ridx = uVar3;
      if (bsel->sel_vector != (sel_t *)0x0) {
        local_58.ridx = (idx_t)bsel->sel_vector[uVar3];
      }
      uVar2 = uVar3;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)ssel->sel_vector[uVar3];
      }
      ArgMinMaxBase<duckdb::GreaterThan,true>::
      Operation<duckdb::hugeint_t,int,duckdb::ArgMinMaxState<duckdb::hugeint_t,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                (states[uVar2],adata + local_58.lidx,bdata + local_58.ridx,&local_58);
    }
  }
  else {
    for (uVar3 = 0; count != uVar3; uVar3 = uVar3 + 1) {
      local_58.lidx = uVar3;
      if (asel->sel_vector != (sel_t *)0x0) {
        local_58.lidx = (idx_t)asel->sel_vector[uVar3];
      }
      local_58.ridx = uVar3;
      if (bsel->sel_vector != (sel_t *)0x0) {
        local_58.ridx = (idx_t)bsel->sel_vector[uVar3];
      }
      uVar2 = uVar3;
      if (ssel->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)ssel->sel_vector[uVar3];
      }
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&avalidity->super_TemplatedValidityMask<unsigned_long>,local_58.lidx);
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&bvalidity->super_TemplatedValidityMask<unsigned_long>,local_58.ridx);
        if (bVar1) {
          ArgMinMaxBase<duckdb::GreaterThan,true>::
          Operation<duckdb::hugeint_t,int,duckdb::ArgMinMaxState<duckdb::hugeint_t,int>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                    (states[uVar2],adata + local_58.lidx,bdata + local_58.ridx,&local_58);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryScatterLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                     const B_TYPE *__restrict bdata, STATE_TYPE **__restrict states, idx_t count,
	                                     const SelectionVector &asel, const SelectionVector &bsel,
	                                     const SelectionVector &ssel, ValidityMask &avalidity,
	                                     ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
					                                                       bdata[input.ridx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				auto sidx = ssel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*states[sidx], adata[input.lidx],
				                                                       bdata[input.ridx], input);
			}
		}
	}